

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O2

UNewDataMemory *
udata_create(char *dir,char *type,char *name,UDataInfo *pInfo,char *comment,UErrorCode *pErrorCode)

{
  UNewDataMemory *buffer;
  size_t sVar1;
  FileStream *fileStream;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  uint8_t bytes [16];
  char filename [512];
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((name == (char *)0x0) || ((pInfo == (UDataInfo *)0x0 || (*name == '\0')))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      buffer = (UNewDataMemory *)uprv_malloc_63(0x10);
      if (buffer == (UNewDataMemory *)0x0) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        iVar2 = 0;
        if ((dir != (char *)0x0) && (*dir != '\0')) {
          sVar1 = strlen(dir);
          iVar2 = (uint)(dir[sVar1 - 1] != '/') + (int)sVar1;
        }
        sVar1 = strlen(name);
        iVar2 = (int)sVar1 + iVar2;
        if ((type != (char *)0x0) && (*type != '\0')) {
          sVar1 = strlen(type);
          iVar2 = iVar2 + (int)sVar1;
        }
        if (iVar2 < 0x200) {
          if ((dir == (char *)0x0) || (*dir == '\0')) {
            filename[0] = '\0';
          }
          else {
            sVar1 = strlen(dir);
            strcpy(filename,dir);
            if (bytes[sVar1 + 0xf] != '/') {
              (filename + sVar1)[0] = '/';
              (filename + sVar1)[1] = '\0';
            }
          }
          strcat(filename,name);
          if ((type != (char *)0x0) && (*type != '\0')) {
            sVar1 = strlen(filename);
            (filename + sVar1)[0] = '.';
            (filename + sVar1)[1] = '\0';
            strcat(filename,type);
          }
          fileStream = T_FileStream_open(filename,"wb");
          buffer->file = fileStream;
          if (fileStream != (FileStream *)0x0) {
            uVar4 = pInfo->size + 4;
            uVar3 = 0;
            if ((comment != (char *)0x0) && (uVar3 = 0, *comment != '\0')) {
              sVar1 = strlen(comment);
              uVar4 = uVar4 + (short)sVar1 + 1;
              uVar3 = (int)sVar1 + 1U & 0xffff;
            }
            buffer->headerSize = uVar4 + 0xf & 0xfff0;
            buffer->magic1 = 0xda;
            buffer->magic2 = '\'';
            T_FileStream_write(fileStream,&buffer->headerSize,4);
            T_FileStream_write(buffer->file,pInfo,(uint)pInfo->size);
            if (uVar3 != 0) {
              T_FileStream_write(buffer->file,comment,uVar3);
            }
            if ((uVar4 & 0xf) == 0) {
              return buffer;
            }
            uVar3 = 0x10 - (uVar4 & 0xf);
            memset(bytes,0,(ulong)uVar3);
            T_FileStream_write(buffer->file,bytes,uVar3);
            return buffer;
          }
          uprv_free_63(buffer);
          *pErrorCode = U_FILE_ACCESS_ERROR;
        }
        else {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          uprv_free_63(buffer);
        }
      }
    }
  }
  return (UNewDataMemory *)0x0;
}

Assistant:

U_CAPI UNewDataMemory * U_EXPORT2
udata_create(const char *dir, const char *type, const char *name,
             const UDataInfo *pInfo,
             const char *comment,
             UErrorCode *pErrorCode) {
    UNewDataMemory *pData;
    uint16_t headerSize, commentLength;
    char filename[512];
    uint8_t bytes[16];
    int32_t length;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    } else if(name==NULL || *name==0 || pInfo==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    /* allocate the data structure */
    pData=(UNewDataMemory *)uprv_malloc(sizeof(UNewDataMemory));
    if(pData==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    
    /* Check that the full path won't be too long */
    length = 0;					/* Start with nothing */
    if(dir != NULL  && *dir !=0)	/* Add directory length if one was given */
    {
    	length += static_cast<int32_t>(strlen(dir));
	
    	/* Add 1 if dir doesn't end with path sep */
        if (dir[strlen(dir) - 1]!= U_FILE_SEP_CHAR) {
            length++;
        }
	}
    length += static_cast<int32_t>(strlen(name));		/* Add the filename length */

    if(type != NULL  && *type !=0) { /* Add directory length if  given */
        length += static_cast<int32_t>(strlen(type));
    }

        
     /* LDH buffer Length error check */
    if(length  > ((int32_t)sizeof(filename) - 1))
    {
   	    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
   	    uprv_free(pData);
	    return NULL;
    }
   
    /* open the output file */
    if(dir!=NULL && *dir!=0) { /* if dir has a value, we prepend it to the filename */
        char *p=filename+strlen(dir);
        uprv_strcpy(filename, dir);
        if (*(p-1)!=U_FILE_SEP_CHAR) {
            *p++=U_FILE_SEP_CHAR;
            *p=0;
        }
    } else { /* otherwise, we'll output to the current dir */
        filename[0]=0;
    }
    uprv_strcat(filename, name);
    if(type!=NULL && *type!=0) {
        uprv_strcat(filename, ".");
        uprv_strcat(filename, type);
    }
    pData->file=T_FileStream_open(filename, "wb");
    if(pData->file==NULL) {
        uprv_free(pData);
        *pErrorCode=U_FILE_ACCESS_ERROR;
        return NULL;
    }

    /* write the header information */
    headerSize=(uint16_t)(pInfo->size+4);
    if(comment!=NULL && *comment!=0) {
        commentLength=(uint16_t)(uprv_strlen(comment)+1);
        headerSize+=commentLength;
    } else {
        commentLength=0;
    }

    /* write the size of the header, take padding into account */
    pData->headerSize=(uint16_t)((headerSize+15)&~0xf);
    pData->magic1=0xda;
    pData->magic2=0x27;
    T_FileStream_write(pData->file, &pData->headerSize, 4);

    /* write the information data */
    T_FileStream_write(pData->file, pInfo, pInfo->size);

    /* write the comment */
    if(commentLength>0) {
        T_FileStream_write(pData->file, comment, commentLength);
    }

    /* write padding bytes to align the data section to 16 bytes */
    headerSize&=0xf;
    if(headerSize!=0) {
        headerSize=(uint16_t)(16-headerSize);
        uprv_memset(bytes, 0, headerSize);
        T_FileStream_write(pData->file, bytes, headerSize);
    }

    return pData;
}